

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  BrotliDictionary *pBVar11;
  size_t sVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uVar21;
  void *pvVar22;
  ulong uVar23;
  byte bVar24;
  size_t sVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  char *pcVar30;
  short sVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  size_t *psVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  size_t *psVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  int last_distance;
  int iVar52;
  bool bVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  ulong uStack_190;
  ulong local_180;
  ulong local_178;
  ulong local_128;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  size_t *local_c8;
  
  bVar24 = literal_context_lut[8];
  uVar5 = (position - 3) + num_bytes;
  sVar25 = position;
  if (3 < num_bytes) {
    sVar25 = uVar5;
  }
  lVar42 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar42 = 0x40;
  }
  lVar10 = *(long *)(literal_context_lut + 0x10);
  uVar47 = *(ulong *)dist_cache;
  uVar2 = position + num_bytes;
  uVar14 = (params->dist).alphabet_size_limit;
  if (4 < (int)uVar14) {
    iVar16 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar16 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar16 + 1;
    (hasher->common).params.type = iVar16 + -2;
    (hasher->common).params.bucket_bits = iVar16 + 2;
    (hasher->common).params.block_bits = iVar16 + -3;
    (hasher->common).params.hash_len = iVar16 + 3;
    if (10 < uVar14) {
      iVar16 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar16 + -1;
      (hasher->common).is_prepared_ = iVar16 + 1;
      *(int *)&hasher->privat = iVar16 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar16 + 2;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar16 + 3,iVar16 + -3);
    }
  }
  uVar6 = (1L << (bVar24 & 0x3f)) - 0x10;
  uVar23 = lVar42 + position;
  lVar4 = position - 1;
  local_c8 = last_insert_len;
  auVar55 = _DAT_001360d0;
LAB_00103e91:
LAB_00103ea5:
  uVar46 = position;
  if (uVar2 <= uVar46 + 4) {
    *(ulong *)dist_cache = (uVar47 + uVar2) - uVar46;
    *(long *)commands = *(long *)commands + ((long)local_c8 - (long)last_insert_len >> 4);
    return;
  }
  local_128 = uVar2 - uVar46;
  uVar19 = uVar6;
  if (uVar46 < uVar6) {
    uVar19 = uVar46;
  }
  local_d0 = lVar10 + uVar46;
  if (uVar6 <= lVar10 + uVar46) {
    local_d0 = uVar6;
  }
  uVar26 = *(ulong *)(literal_context_lut + 0x50);
  pBVar11 = (params->dictionary).words;
  lVar32 = *(long *)&(params->dictionary).num_transforms;
  uVar17 = uVar46 & ringbuffer_mask;
  psVar43 = *(size_t **)backward_references;
  psVar38 = num_literals + (long)psVar43 * 2;
  do {
    bVar54 = back_refs_position == (size_t *)0x0;
    if (back_refs_position <= psVar43) {
LAB_00103fe9:
      piVar3 = (int *)(ringbuffer + uVar17);
      uVar35 = (ulong)((uint)local_128 & 7);
      uVar18 = 0x7e4;
      uVar41 = 0;
      local_110 = 0;
      uVar49 = 0;
      uVar39 = 0;
      do {
        if (uVar49 == (long)(int)(params->dist).alphabet_size_limit) {
          uVar14 = (uint)(*piVar3 * 0x1e35a7bd) >>
                   ((byte)(params->dist).distance_postfix_bits & 0x1f);
          lVar32 = lVar32 + (ulong)(uVar14 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4;
          uVar7 = *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2);
          uVar33 = (ulong)uVar7;
          piVar1 = &(params->hasher).num_last_distances_to_check;
          uVar49 = 0;
          if (*(ulong *)piVar1 <= uVar33) {
            uVar49 = uVar33 - *(long *)piVar1;
          }
          uVar36 = (params->dist).num_direct_distance_codes;
          do {
            uVar37 = uVar39;
            local_108 = uVar41;
            local_e0 = uVar18;
            uVar40 = local_110;
            uVar20 = uVar37 + uVar17;
            do {
              do {
                do {
                  do {
                    if (uVar33 <= uVar49) {
LAB_0010439f:
                      *(int *)(lVar32 + (ulong)(uVar36 & uVar7) * 4) = (int)uVar46;
                      *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2) = uVar7 + 1;
                      if (local_e0 != 0x7e4) {
                        iVar16 = 0;
                        bVar53 = true;
                        local_180 = uVar40;
                        goto LAB_0010466d;
                      }
                      if (!bVar54) {
                        if (back_refs_position <= psVar43) goto LAB_00104790;
                        uVar18 = (ulong)(int)*psVar38;
                        goto LAB_0010469a;
                      }
                      sVar12 = (params->dist).max_distance;
                      uVar19 = *(ulong *)(sVar12 + 8);
                      local_178 = *(ulong *)(sVar12 + 0x10);
                      bVar54 = true;
                      if (local_178 < uVar19 >> 7) goto LAB_00104793;
                      uVar17 = (ulong)((uint)(*piVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      lVar32 = *(long *)(literal_context_lut + 0x78);
                      local_e0 = 0x7e4;
                      iVar16 = 0;
                      lVar34 = 0;
                      goto LAB_0010445e;
                    }
                    uVar33 = uVar33 - 1;
                    uVar48 = *(uint *)(lVar32 + (ulong)((uint)uVar33 & uVar36) * 4);
                    uVar41 = uVar46 - uVar48;
                    if (uVar19 < uVar41) goto LAB_0010439f;
                  } while (ringbuffer_mask < uVar20);
                  uVar39 = (ulong)(uVar48 & (uint)ringbuffer_mask);
                  uVar18 = uVar39 + uVar37;
                } while ((ringbuffer_mask < uVar18) || (ringbuffer[uVar20] != ringbuffer[uVar18]));
                uVar18 = 0;
                lVar34 = 0;
LAB_0010428d:
                uVar44 = local_128 & 0xfffffffffffffff8;
                uVar28 = uVar35;
                if (local_128 >> 3 == uVar18) {
                  for (; (local_110 = local_128, uVar28 != 0 &&
                         (local_110 = uVar44,
                         ringbuffer[uVar44 + uVar39] == *(uint8_t *)((long)piVar3 + uVar44)));
                      uVar44 = uVar44 + 1) {
                    uVar28 = uVar28 - 1;
                  }
                }
                else {
                  if (*(ulong *)(piVar3 + uVar18 * 2) ==
                      *(ulong *)(ringbuffer + uVar18 * 8 + uVar39)) goto code_r0x001042aa;
                  uVar39 = *(ulong *)(ringbuffer + uVar18 * 8 + uVar39) ^
                           *(ulong *)(piVar3 + uVar18 * 2);
                  uVar18 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  local_110 = (uVar18 >> 3 & 0x1fffffff) - lVar34;
                }
                if ((psVar43 < back_refs_position) &&
                   ((ulong)(long)(int)*psVar38 < local_110 + uVar46)) {
                  local_110 = (long)(int)*psVar38 - uVar46;
                }
              } while (local_110 < 4);
              iVar16 = 0x1f;
              if ((uint)uVar41 != 0) {
                for (; (uint)uVar41 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              uVar18 = (ulong)(iVar16 * -0x1e + 0x780) + local_110 * 0x87;
              uVar39 = local_110;
            } while (uVar18 <= local_e0);
          } while( true );
        }
        uVar33 = (ulong)*(int *)((long)&(hasher->common).extra + uVar49 * 4);
        if (((uVar33 <= uVar19) && (uVar46 - uVar33 < uVar46)) &&
           (uVar39 + uVar17 <= ringbuffer_mask)) {
          uVar20 = uVar46 - uVar33 & ringbuffer_mask;
          if ((uVar20 + uVar39 <= ringbuffer_mask) &&
             (ringbuffer[uVar39 + uVar17] == ringbuffer[uVar20 + uVar39])) {
            uVar40 = 0;
            lVar34 = 0;
LAB_00104092:
            uVar37 = local_128 & 0xfffffffffffffff8;
            uVar44 = uVar35;
            if (local_128 >> 3 == uVar40) {
              for (; (uVar40 = local_128, uVar44 != 0 &&
                     (uVar40 = uVar37,
                     ringbuffer[uVar37 + uVar20] == *(uint8_t *)((long)piVar3 + uVar37)));
                  uVar37 = uVar37 + 1) {
                uVar44 = uVar44 - 1;
              }
            }
            else {
              if (*(ulong *)(piVar3 + uVar40 * 2) == *(ulong *)(ringbuffer + uVar40 * 8 + uVar20))
              goto code_r0x001040af;
              uVar40 = *(ulong *)(ringbuffer + uVar40 * 8 + uVar20) ^
                       *(ulong *)(piVar3 + uVar40 * 2);
              uVar20 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar40 = (uVar20 >> 3 & 0x1fffffff) - lVar34;
            }
            if ((psVar43 < back_refs_position) && ((ulong)(long)(int)*psVar38 < uVar40 + uVar46)) {
              uVar40 = (long)(int)*psVar38 - uVar46;
            }
            if (((2 < uVar40) || ((uVar49 < 2 && (uVar40 == 2)))) &&
               (uVar20 = uVar40 * 0x87 + 0x78f, uVar18 < uVar20)) {
              if (uVar49 != 0) {
                uVar20 = uVar20 - ((0x1ca10U >> ((byte)uVar49 & 0xe) & 0xe) + 0x27);
              }
              if (uVar18 < uVar20) {
                uVar18 = uVar20;
                uVar41 = uVar33;
                uVar39 = uVar40;
                local_110 = uVar40;
              }
            }
          }
        }
        uVar49 = uVar49 + 1;
      } while( true );
    }
    uVar18 = (ulong)(int)*psVar38;
    if (uVar46 <= uVar18) {
      if (uVar46 == uVar18) {
        uVar14 = (uint)psVar38[1];
        local_108 = (ulong)(int)uVar14;
        if ((uVar46 <= uVar46 - local_108) || (*(uint *)((long)psVar38 + 0xc) < uVar14))
        goto LAB_0010469a;
        uVar26 = uVar46 - local_108 & ringbuffer_mask;
        uVar19 = local_128 & 0xfffffffffffffff8;
        uVar18 = 0;
        lVar32 = 0;
        break;
      }
      bVar54 = false;
      goto LAB_00103fe9;
    }
    psVar43 = (size_t *)((long)psVar43 + 1);
    *(size_t **)backward_references = psVar43;
    psVar38 = psVar38 + 2;
  } while( true );
LAB_00103faf:
  if (local_128 >> 3 == uVar18) goto LAB_00104974;
  if (*(ulong *)(ringbuffer + uVar18 * 8 + uVar17) != *(ulong *)(ringbuffer + uVar18 * 8 + uVar26))
  {
    uVar26 = *(ulong *)(ringbuffer + uVar18 * 8 + uVar26) ^
             *(ulong *)(ringbuffer + uVar18 * 8 + uVar17);
    uVar19 = 0;
    if (uVar26 != 0) {
      for (; (uVar26 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
      }
    }
    uVar41 = (uVar19 >> 3 & 0x1fffffff) - lVar32;
    goto LAB_001048e0;
  }
  lVar32 = lVar32 + -8;
  uVar18 = uVar18 + 1;
  goto LAB_00103faf;
LAB_00104974:
  uVar18 = (ulong)((uint)local_128 & 7);
  for (; (bVar54 = uVar18 != 0, uVar18 = uVar18 - 1, uVar41 = local_128, bVar54 &&
         (uVar41 = uVar19, ringbuffer[uVar19 + uVar26] == ringbuffer[uVar19 + uVar17]));
      uVar19 = uVar19 + 1) {
  }
LAB_001048e0:
  local_180 = (long)*(int *)((long)psVar38 + 4);
  if (uVar41 < (ulong)(long)*(int *)((long)psVar38 + 4)) {
    local_180 = uVar41;
  }
  iVar16 = 0x1f;
  if (uVar14 != 0) {
    for (; uVar14 >> iVar16 == 0; iVar16 = iVar16 + -1) {
    }
  }
  local_e0 = (ulong)(iVar16 * -0x1e + 0x780) + local_180 * 0x87;
  bVar54 = false;
  bVar53 = false;
  iVar16 = 0;
LAB_0010466d:
  if (0x7e4 < local_e0) goto LAB_001049af;
LAB_00104793:
  uVar47 = uVar47 + 1;
  position = uVar46 + 1;
  if (bVar54 && uVar23 < position) {
    if (uVar23 + (uint)((int)lVar42 * 4) < position) {
      uVar19 = uVar46 + 0x11;
      if (uVar2 - 4 <= uVar46 + 0x11) {
        uVar19 = uVar2 - 4;
      }
      for (; position < uVar19; position = position + 4) {
        uVar14 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                 ((byte)(params->dist).distance_postfix_bits & 0x1f);
        pBVar11 = (params->dictionary).words;
        uVar7 = *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2);
        *(int *)((ulong)((params->dist).num_direct_distance_codes & (uint)uVar7) * 4 +
                 *(long *)&(params->dictionary).num_transforms +
                (ulong)(uVar14 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4) =
             (int)position;
        *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2) = uVar7 + 1;
        uVar47 = uVar47 + 4;
      }
    }
    else {
      uVar19 = uVar46 + 9;
      if (uVar5 <= uVar46 + 9) {
        uVar19 = uVar5;
      }
      for (; position < uVar19; position = position + 2) {
        uVar14 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                 ((byte)(params->dist).distance_postfix_bits & 0x1f);
        pBVar11 = (params->dictionary).words;
        uVar7 = *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2);
        *(int *)((ulong)((params->dist).num_direct_distance_codes & (uint)uVar7) * 4 +
                 *(long *)&(params->dictionary).num_transforms +
                (ulong)(uVar14 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4) =
             (int)position;
        *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2) = uVar7 + 1;
        uVar47 = uVar47 + 2;
      }
    }
  }
  goto LAB_00103ea5;
LAB_0010445e:
  if (lVar34 == 2) goto LAB_0010489e;
  uVar19 = uVar19 + 1;
  *(ulong *)(sVar12 + 8) = uVar19;
  bVar24 = *(byte *)(lVar32 + uVar17);
  uVar18 = (ulong)bVar24;
  if ((uVar18 != 0) && (uVar18 <= local_128)) {
    uVar35 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar17 * 2);
    lVar45 = *(long *)(literal_context_lut + 0x58);
    lVar27 = uVar35 * uVar18 + *(long *)(lVar45 + 0xa8) +
             (ulong)*(uint *)(lVar45 + 0x20 + uVar18 * 4);
    uVar39 = (ulong)(bVar24 & 0xfffffff8);
    uVar41 = 0;
LAB_001044c8:
    if (uVar39 == uVar41) {
      local_180 = (ulong)(bVar24 & 7);
      pcVar30 = (char *)(lVar27 + uVar41);
      for (; (bVar54 = local_180 != 0, local_180 = local_180 - 1, uVar41 = uVar18, bVar54 &&
             (uVar41 = uVar39, *(char *)((long)piVar3 + uVar39) == *pcVar30)); uVar39 = uVar39 + 1)
      {
        pcVar30 = pcVar30 + 1;
      }
    }
    else {
      uVar49 = *(ulong *)(lVar27 + uVar41);
      if (uVar49 == *(ulong *)((long)piVar3 + uVar41)) goto code_r0x001044e4;
      uVar49 = *(ulong *)((long)piVar3 + uVar41) ^ uVar49;
      uVar39 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      uVar41 = (uVar39 >> 3 & 0x1fffffff) + uVar41;
    }
    if ((uVar41 != 0) &&
       ((uVar18 < *(uint *)(literal_context_lut + 100) + uVar41 &&
        (uVar18 = ((uVar18 - uVar41) * 4 +
                   (ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                 ((char)(uVar18 - uVar41) * '\x06' & 0x3fU)) & 0x3f) <<
                  (*(byte *)(lVar45 + uVar18) & 0x3f)) + uVar35 + local_d0 + 1, uVar18 <= uVar26))))
    {
      iVar52 = 0x1f;
      if ((uint)uVar18 != 0) {
        for (; (uint)uVar18 >> iVar52 == 0; iVar52 = iVar52 + -1) {
        }
      }
      uVar39 = (uVar41 * 0x87 - (ulong)(uint)(iVar52 * 0x1e)) + 0x780;
      if (local_e0 <= uVar39) {
        iVar16 = (uint)bVar24 - (int)uVar41;
        local_178 = local_178 + 1;
        *(ulong *)(sVar12 + 0x10) = local_178;
        local_e0 = uVar39;
        local_108 = uVar18;
        uVar40 = uVar41;
      }
    }
  }
  lVar34 = lVar34 + 1;
  uVar17 = uVar17 + 1;
  goto LAB_0010445e;
LAB_0010489e:
  bVar54 = true;
  bVar53 = true;
  local_180 = uVar40;
  goto LAB_0010466d;
code_r0x001044e4:
  uVar41 = uVar41 + 8;
  goto LAB_001044c8;
LAB_0010469a:
  if (uVar46 == uVar18) {
    uVar14 = (uint)psVar38[1];
    local_108 = (ulong)(int)uVar14;
    if (*(int *)((long)psVar38 + 0xc) < (int)uVar14) {
      uVar36 = *(uint *)((long)psVar38 + 4);
      uVar26 = (ulong)uVar36;
      if (uVar36 - 4 < 0x15 && (int)uVar14 < 0x7ffffffd) {
        uVar48 = ~(uint)uVar19 + uVar14;
        lVar32 = *(long *)(literal_context_lut + 0x58);
        if ((int)uVar48 >> (*(byte *)(lVar32 + uVar26) & 0x1f) <
            *(int *)(literal_context_lut + 0x60)) {
          uVar9 = *(uint *)(lVar32 + 0x20 + uVar26 * 4);
          uVar8 = kBitMask[*(byte *)(lVar32 + uVar26)];
          lVar32 = *(long *)(lVar32 + 0xa8);
          uVar21 = BrotliGetTransforms();
          pvVar22 = malloc(uVar26 * 10);
          iVar16 = BrotliTransformDictionaryWord
                             (pvVar22,(ulong)uVar9 + lVar32 + (long)(int)((uVar48 & uVar8) * uVar36)
                              ,uVar36,uVar21);
          local_180 = (ulong)iVar16;
          iVar52 = bcmp(ringbuffer + uVar17,pvVar22,local_180);
          auVar55 = _DAT_001360d0;
          if (iVar52 != 0) {
            bVar54 = false;
            goto LAB_00104793;
          }
          iVar52 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> iVar52 == 0; iVar52 = iVar52 + -1) {
            }
          }
          local_e0 = (ulong)(iVar52 * -0x1e + 0x780) + local_180 * 0x87;
          iVar16 = uVar36 - iVar16;
          bVar54 = false;
          bVar53 = false;
          goto LAB_0010466d;
        }
      }
    }
  }
LAB_00104790:
  bVar54 = false;
  goto LAB_00104793;
LAB_001049af:
  if (bVar53) {
    pBVar11 = (params->dictionary).words;
    lVar32 = *(long *)&(params->dictionary).num_transforms;
    uVar17 = (lVar4 + num_bytes) - uVar46;
    uVar14 = 0;
    uVar23 = local_180;
    uVar19 = uVar46;
    uVar26 = local_108;
    local_d8 = uVar17;
    iVar52 = iVar16;
LAB_001049fd:
    uVar41 = (ulong)((uint)uVar17 & 7);
    uVar39 = uVar17 >> 3;
    local_128 = local_128 - 1;
    uVar18 = uVar23 - 1;
    if (local_128 <= uVar23 - 1) {
      uVar18 = local_128;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar18 = 0;
    }
    uVar46 = uVar19 + 1;
    uVar35 = uVar6;
    if (uVar46 < uVar6) {
      uVar35 = uVar46;
    }
    local_d0 = lVar10 + uVar19 + 1;
    if (uVar6 <= local_d0) {
      local_d0 = uVar6;
    }
    uVar49 = *(ulong *)(literal_context_lut + 0x50);
    uVar33 = uVar46 & ringbuffer_mask;
    psVar43 = *(size_t **)backward_references;
    psVar38 = num_literals + (long)psVar43 * 2;
LAB_00104ac7:
    if (psVar43 < back_refs_position) {
      if ((ulong)(long)(int)*psVar38 < uVar46) goto code_r0x00104ad4;
      if (uVar46 == (long)(int)*psVar38 && !bVar54) {
        local_108 = (ulong)(int)(uint)psVar38[1];
        if ((uVar46 <= uVar46 - local_108) || (*(uint *)((long)psVar38 + 0xc) < (uint)psVar38[1])) {
          local_180 = 0;
          local_108 = 0;
LAB_00104f61:
          local_100 = 0x7e4;
          iVar16 = 0;
          if (uVar46 == (long)(int)*psVar38) {
            iVar13 = (int)psVar38[1];
            if (iVar13 <= *(int *)((long)psVar38 + 0xc)) goto LAB_00104fa7;
            uVar14 = *(uint *)((long)psVar38 + 4);
            uVar23 = (ulong)uVar14;
            if (uVar14 - 4 < 0x15 && iVar13 < 0x7ffffffd) {
              iVar16 = 0;
              uVar36 = ~(uint)uVar35 + iVar13;
              lVar32 = *(long *)(literal_context_lut + 0x58);
              iVar52 = (int)uVar36 >> (*(byte *)(lVar32 + uVar23) & 0x1f);
              if (iVar52 < *(int *)(literal_context_lut + 0x60)) {
                uVar48 = *(uint *)(lVar32 + 0x20 + uVar23 * 4);
                uVar9 = kBitMask[*(byte *)(lVar32 + uVar23)];
                lVar32 = *(long *)(lVar32 + 0xa8);
                uVar21 = BrotliGetTransforms();
                pvVar22 = malloc(uVar23 * 10);
                iVar52 = BrotliTransformDictionaryWord
                                   (pvVar22,(ulong)uVar48 + lVar32 +
                                            (long)(int)((uVar36 & uVar9) * uVar14),uVar23,uVar21,
                                    iVar52);
                iVar15 = bcmp(ringbuffer + uVar33,pvVar22,(long)iVar52);
                auVar55 = _DAT_001360d0;
                if (iVar15 == 0) {
                  iVar16 = uVar14 - iVar52;
                  local_180 = (long)iVar52;
                  local_108 = (long)iVar13;
                }
              }
            }
            else {
              iVar16 = 0;
            }
            goto LAB_00105480;
          }
          goto LAB_00104fa7;
        }
        uVar23 = uVar46 - local_108 & ringbuffer_mask;
        uVar19 = 0;
        lVar32 = 0;
        goto LAB_0010540b;
      }
    }
    piVar3 = (int *)(ringbuffer + uVar33);
    uVar40 = 0x7e4;
    uVar20 = 0;
    local_178 = 0;
    uVar37 = 0;
    do {
      if (uVar37 == (long)(int)(params->dist).alphabet_size_limit) {
        uVar36 = (uint)(*piVar3 * 0x1e35a7bd) >> ((byte)(params->dist).distance_postfix_bits & 0x1f)
        ;
        lVar34 = lVar32 + (ulong)(uVar36 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4;
        uVar7 = *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar36 * 2);
        uVar44 = (ulong)uVar7;
        piVar1 = &(params->hasher).num_last_distances_to_check;
        uVar37 = 0;
        if (*(ulong *)piVar1 <= uVar44) {
          uVar37 = uVar44 - *(long *)piVar1;
        }
        uVar48 = (params->dist).num_direct_distance_codes;
        uVar28 = local_178;
        do {
          local_180 = uVar28;
          uVar51 = uVar18;
          local_100 = uVar40;
          local_108 = uVar20;
          uVar50 = uVar51 + uVar33;
          do {
            do {
              do {
                do {
                  if (uVar44 <= uVar37) {
LAB_00104e33:
                    *(int *)(lVar34 + (ulong)(uVar48 & uVar7) * 4) = (int)uVar46;
                    *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar36 * 2) = uVar7 + 1;
                    iVar16 = 0;
                    if (local_100 != 0x7e4) goto LAB_00104fa7;
                    if (!bVar54) {
                      local_100 = 0x7e4;
                      if (back_refs_position <= psVar43) goto LAB_00104fa7;
                      goto LAB_00104f61;
                    }
                    sVar12 = (params->dist).max_distance;
                    uVar18 = *(ulong *)(sVar12 + 8);
                    local_e8 = *(ulong *)(sVar12 + 0x10);
                    if (uVar18 >> 7 <= local_e8) {
                      uVar41 = (ulong)((uint)(*piVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      lVar34 = *(long *)(literal_context_lut + 0x78);
                      local_100 = 0x7e4;
                      iVar16 = 0;
                      lVar45 = 0;
                      goto LAB_0010507f;
                    }
                    local_100 = 0x7e4;
                    goto LAB_00104fa7;
                  }
                  uVar44 = uVar44 - 1;
                  uVar9 = *(uint *)(lVar34 + (ulong)((uint)uVar44 & uVar48) * 4);
                  uVar20 = uVar46 - uVar9;
                  if (uVar35 < uVar20) goto LAB_00104e33;
                } while (ringbuffer_mask < uVar50);
                uVar40 = (ulong)(uVar9 & (uint)ringbuffer_mask);
                uVar18 = uVar40 + uVar51;
              } while ((ringbuffer_mask < uVar18) || (ringbuffer[uVar50] != ringbuffer[uVar18]));
              uVar18 = 0;
              lVar45 = 0;
LAB_00104d76:
              if (uVar39 == uVar18) {
                uVar28 = uVar41;
                for (uVar18 = -lVar45;
                    (bVar53 = uVar28 != 0, uVar28 = uVar28 - 1, bVar53 &&
                    (ringbuffer[uVar18 + uVar40] == *(uint8_t *)((long)piVar3 + uVar18)));
                    uVar18 = uVar18 + 1) {
                }
              }
              else {
                if (*(ulong *)(piVar3 + uVar18 * 2) == *(ulong *)(ringbuffer + uVar18 * 8 + uVar40))
                goto code_r0x00104d96;
                uVar40 = *(ulong *)(ringbuffer + uVar18 * 8 + uVar40) ^
                         *(ulong *)(piVar3 + uVar18 * 2);
                uVar18 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (uVar18 >> 3 & 0x1fffffff) - lVar45;
              }
              if ((psVar43 < back_refs_position && !bVar54) &&
                 ((ulong)(long)(int)*psVar38 < uVar18 + uVar46)) {
                uVar18 = (long)(int)*psVar38 - uVar46;
              }
            } while (uVar18 < 4);
            iVar16 = 0x1f;
            if ((uint)uVar20 != 0) {
              for (; (uint)uVar20 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            uVar40 = (ulong)(iVar16 * -0x1e + 0x780) + uVar18 * 0x87;
            uVar28 = uVar18;
          } while (uVar40 <= local_100);
        } while( true );
      }
      uVar44 = (ulong)*(int *)((long)&(hasher->common).extra + uVar37 * 4);
      if (((uVar44 <= uVar35) && (uVar46 - uVar44 < uVar46)) && (uVar33 + uVar18 <= ringbuffer_mask)
         ) {
        uVar28 = uVar46 - uVar44 & ringbuffer_mask;
        if ((uVar28 + uVar18 <= ringbuffer_mask) &&
           (ringbuffer[uVar33 + uVar18] == ringbuffer[uVar28 + uVar18])) {
          uVar50 = 0;
          lVar34 = 0;
LAB_00104b81:
          if (uVar39 == uVar50) {
            uVar51 = uVar41;
            for (uVar50 = -lVar34;
                (bVar53 = uVar51 != 0, uVar51 = uVar51 - 1, bVar53 &&
                (ringbuffer[uVar50 + uVar28] == *(uint8_t *)((long)piVar3 + uVar50)));
                uVar50 = uVar50 + 1) {
            }
          }
          else {
            if (*(ulong *)(piVar3 + uVar50 * 2) == *(ulong *)(ringbuffer + uVar50 * 8 + uVar28))
            goto code_r0x00104ba1;
            uVar50 = *(ulong *)(ringbuffer + uVar50 * 8 + uVar28) ^ *(ulong *)(piVar3 + uVar50 * 2);
            uVar28 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar50 = (uVar28 >> 3 & 0x1fffffff) - lVar34;
          }
          if ((psVar43 < back_refs_position && !bVar54) &&
             ((ulong)(long)(int)*psVar38 < uVar50 + uVar46)) {
            uVar50 = (long)(int)*psVar38 - uVar46;
          }
          if (((2 < uVar50) || ((uVar37 < 2 && (uVar50 == 2)))) &&
             (uVar28 = uVar50 * 0x87 + 0x78f, uVar40 < uVar28)) {
            if (uVar37 != 0) {
              uVar28 = uVar28 - ((0x1ca10U >> ((byte)uVar37 & 0xe) & 0xe) + 0x27);
            }
            if (uVar40 < uVar28) {
              uVar20 = uVar44;
              uVar40 = uVar28;
              uVar18 = uVar50;
              local_178 = uVar50;
            }
          }
        }
      }
      uVar37 = uVar37 + 1;
    } while( true );
  }
  goto LAB_0010548e;
LAB_0010540b:
  if (uVar39 == uVar19) goto LAB_00105868;
  if (*(ulong *)(ringbuffer + uVar19 * 8 + uVar33) != *(ulong *)(ringbuffer + uVar19 * 8 + uVar23))
  {
    uVar19 = *(ulong *)(ringbuffer + uVar19 * 8 + uVar23) ^
             *(ulong *)(ringbuffer + uVar19 * 8 + uVar33);
    uVar23 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
      }
    }
    uVar19 = (uVar23 >> 3 & 0x1fffffff) - lVar32;
    goto LAB_00105441;
  }
  lVar32 = lVar32 + -8;
  uVar19 = uVar19 + 1;
  goto LAB_0010540b;
LAB_00105868:
  uVar26 = (ulong)((byte)local_d8 & 7);
  for (uVar19 = -lVar32;
      (bVar54 = uVar26 != 0, uVar26 = uVar26 - 1, bVar54 &&
      (ringbuffer[uVar19 + uVar23] == ringbuffer[uVar19 + uVar33])); uVar19 = uVar19 + 1) {
  }
LAB_00105441:
  local_180 = (long)*(int *)((long)psVar38 + 4);
  if (uVar19 < (ulong)(long)*(int *)((long)psVar38 + 4)) {
    local_180 = uVar19;
  }
  iVar16 = 0;
LAB_00105480:
  uVar47 = uVar47 + 1;
LAB_0010548e:
  if (local_d0 < local_108) {
LAB_001054a7:
    uStack_190 = local_108 + 0xf;
  }
  else {
    uVar23 = (ulong)*(int *)&(hasher->common).extra;
    if (local_108 == uVar23) {
      uStack_190 = 0;
      goto LAB_0010553e;
    }
    uVar19 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
    uStack_190 = 1;
    if (local_108 != uVar19) {
      uVar23 = (local_108 + 3) - uVar23;
      if (uVar23 < 7) {
        bVar24 = (byte)((int)uVar23 << 2);
        uVar14 = 0x9750468;
      }
      else {
        uVar19 = (local_108 + 3) - uVar19;
        if (6 < uVar19) {
          uStack_190 = 2;
          if ((local_108 != (long)(int)(hasher->common).dict_num_lookups) &&
             (uStack_190 = 3,
             local_108 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
          goto LAB_001054a7;
          goto LAB_001054ab;
        }
        bVar24 = (byte)((int)uVar19 << 2);
        uVar14 = 0xfdb1ace;
      }
      uStack_190 = (ulong)(uVar14 >> (bVar24 & 0x1f) & 0xf);
    }
  }
LAB_001054ab:
  if ((local_108 <= local_d0) && (uStack_190 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    pvVar22 = (hasher->common).extra;
    *(void **)((long)&(hasher->common).extra + 4) = pvVar22;
    iVar52 = (int)local_108;
    *(int *)&(hasher->common).extra = iVar52;
    uVar14 = (params->dist).alphabet_size_limit;
    if (4 < (int)uVar14) {
      *(int *)&(hasher->common).dict_num_matches = iVar52 + auVar55._0_4_;
      *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar52 + auVar55._4_4_;
      (hasher->common).params.type = iVar52 + auVar55._8_4_;
      (hasher->common).params.bucket_bits = iVar52 + auVar55._12_4_;
      (hasher->common).params.block_bits = iVar52 + -3;
      (hasher->common).params.hash_len = iVar52 + 3;
      if (10 < uVar14) {
        iVar52 = (int)pvVar22;
        (hasher->common).params.num_last_distances_to_check = iVar52 + auVar55._0_4_;
        (hasher->common).is_prepared_ = iVar52 + auVar55._4_4_;
        *(int *)&hasher->privat = iVar52 + auVar55._8_4_;
        *(int *)((long)&hasher->privat + 4) = iVar52 + auVar55._12_4_;
        (hasher->privat)._H5.block_size_ = CONCAT44(iVar52 + 3,iVar52 + -3);
      }
    }
  }
LAB_0010553e:
  uVar14 = (uint)uVar47;
  *(uint *)local_c8 = uVar14;
  *(uint *)((long)local_c8 + 4) = iVar16 << 0x19 | (uint)local_180;
  uVar23 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar36 = 0;
  if (uVar23 <= uStack_190) {
    bVar24 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar19 = ((4L << (bVar24 & 0x3f)) + (uStack_190 - *(uint *)(literal_context_lut + 0x44))) - 0x10
    ;
    uVar36 = 0x1f;
    uVar48 = (uint)uVar19;
    if (uVar48 != 0) {
      for (; uVar48 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar36 ^ 0xffffffe0) + 0x1f;
    uVar26 = (ulong)((uVar19 >> ((ulong)uVar36 & 0x3f) & 1) != 0);
    lVar32 = (ulong)uVar36 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uStack_190 = (~(-1 << (bVar24 & 0x1f)) & uVar48) + uVar23 +
                 (uVar26 + lVar32 * 2 + 0xfffe << (bVar24 & 0x3f)) | lVar32 * 0x400;
    uVar36 = (uint)(uVar19 - (uVar26 + 2 << ((byte)uVar36 & 0x3f)) >> (bVar24 & 0x3f));
  }
  *(short *)((long)local_c8 + 0xe) = (short)uStack_190;
  *(uint *)(local_c8 + 1) = uVar36;
  if (5 < uVar47) {
    if (uVar47 < 0x82) {
      uVar14 = 0x1f;
      uVar36 = (uint)(uVar47 - 2);
      if (uVar36 != 0) {
        for (; uVar36 >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar14 = (int)(uVar47 - 2 >> ((char)(uVar14 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar14 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar47 < 0x842) {
      uVar36 = 0x1f;
      if (uVar14 - 0x42 != 0) {
        for (; uVar14 - 0x42 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar14 = (uVar36 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar14 = 0x15;
      if (0x1841 < uVar47) {
        uVar14 = (uint)(ushort)(0x17 - (uVar47 < 0x5842));
      }
    }
  }
  uVar36 = iVar16 + (uint)local_180;
  if (uVar36 < 10) {
    uVar48 = uVar36 - 2;
  }
  else if (uVar36 < 0x86) {
    uVar36 = uVar36 - 6;
    uVar48 = 0x1f;
    if (uVar36 != 0) {
      for (; uVar36 >> uVar48 == 0; uVar48 = uVar48 - 1) {
      }
    }
    uVar48 = (uVar36 >> ((char)(uVar48 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar48 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar48 = 0x17;
    if (uVar36 < 0x846) {
      uVar48 = 0x1f;
      if (uVar36 - 0x46 != 0) {
        for (; uVar36 - 0x46 >> uVar48 == 0; uVar48 = uVar48 - 1) {
        }
      }
      uVar48 = (uVar48 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar48;
  sVar31 = (uVar7 & 7) + ((ushort)uVar14 & 7) * 8;
  if ((((uStack_190 & 0x3ff) == 0) && ((ushort)uVar14 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      sVar31 = sVar31 + 0x40;
    }
  }
  else {
    iVar16 = ((uVar14 & 0xffff) >> 3) * 3 + ((uVar48 & 0xffff) >> 3);
    sVar31 = sVar31 + ((ushort)(0x520d40 >> ((char)iVar16 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar16 * 0x40 + 0x40;
  }
  *(short *)((long)local_c8 + 0xc) = sVar31;
  *num_commands = *num_commands + uVar47;
  position = uVar46 + local_180;
  uVar47 = sVar25;
  if (position < sVar25) {
    uVar47 = position;
  }
  uVar19 = uVar46 + 2;
  if (local_108 < local_180 >> 2) {
    uVar23 = position + local_108 * -4;
    if (uVar23 < uVar19) {
      uVar23 = uVar19;
    }
    uVar19 = uVar23;
    if (uVar47 < uVar23) {
      uVar19 = uVar47;
    }
  }
  uVar23 = lVar42 + local_180 * 2 + uVar46;
  local_c8 = local_c8 + 2;
  for (; uVar19 < uVar47; uVar19 = uVar19 + 1) {
    uVar14 = (uint)(*(int *)(ringbuffer + (uVar19 & ringbuffer_mask)) * 0x1e35a7bd) >>
             ((byte)(params->dist).distance_postfix_bits & 0x1f);
    pBVar11 = (params->dictionary).words;
    uVar7 = *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2);
    *(int *)((ulong)((params->dist).num_direct_distance_codes & (uint)uVar7) * 4 +
             *(long *)&(params->dictionary).num_transforms +
            (ulong)(uVar14 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4) = (int)uVar19;
    *(ushort *)(pBVar11->size_bits_by_length + (ulong)uVar14 * 2) = uVar7 + 1;
  }
  uVar47 = 0;
  goto LAB_00103e91;
code_r0x00104ad4:
  psVar43 = (size_t *)((long)psVar43 + 1);
  *(size_t **)backward_references = psVar43;
  psVar38 = psVar38 + 2;
  goto LAB_00104ac7;
LAB_0010507f:
  if (lVar45 == 2) goto LAB_00104fa7;
  uVar18 = uVar18 + 1;
  *(ulong *)(sVar12 + 8) = uVar18;
  bVar24 = *(byte *)(lVar34 + uVar41);
  uVar39 = (ulong)bVar24;
  if ((uVar39 != 0) && (uVar39 <= local_128)) {
    uVar20 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar41 * 2);
    lVar27 = *(long *)(literal_context_lut + 0x58);
    lVar29 = uVar20 * uVar39 + *(long *)(lVar27 + 0xa8) +
             (ulong)*(uint *)(lVar27 + 0x20 + uVar39 * 4);
    uVar33 = (ulong)(bVar24 & 0xfffffff8);
    uVar35 = 0;
LAB_001050ef:
    if (uVar33 == uVar35) {
      uVar40 = (ulong)(bVar24 & 7);
      pcVar30 = (char *)(lVar29 + uVar35);
      for (; (bVar53 = uVar40 != 0, uVar40 = uVar40 - 1, uVar35 = uVar39, bVar53 &&
             (uVar35 = uVar33, *(char *)((long)piVar3 + uVar33) == *pcVar30)); uVar33 = uVar33 + 1)
      {
        pcVar30 = pcVar30 + 1;
      }
    }
    else {
      uVar40 = *(ulong *)(lVar29 + uVar35);
      if (uVar40 == *(ulong *)((long)piVar3 + uVar35)) goto code_r0x0010510b;
      uVar40 = *(ulong *)((long)piVar3 + uVar35) ^ uVar40;
      uVar33 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
        }
      }
      uVar35 = (uVar33 >> 3 & 0x1fffffff) + uVar35;
    }
    if (((uVar35 != 0) && (uVar39 < *(uint *)(literal_context_lut + 100) + uVar35)) &&
       (uVar39 = ((uVar39 - uVar35) * 4 +
                  (ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar39 - uVar35) * '\x06' & 0x3fU)) & 0x3f) <<
                 (*(byte *)(lVar27 + uVar39) & 0x3f)) + uVar20 + local_d0 + 1, uVar39 <= uVar49)) {
      iVar13 = 0x1f;
      if ((uint)uVar39 != 0) {
        for (; (uint)uVar39 >> iVar13 == 0; iVar13 = iVar13 + -1) {
        }
      }
      uVar33 = (uVar35 * 0x87 - (ulong)(uint)(iVar13 * 0x1e)) + 0x780;
      if (local_100 <= uVar33) {
        iVar16 = (uint)bVar24 - (int)uVar35;
        local_e8 = local_e8 + 1;
        *(ulong *)(sVar12 + 0x10) = local_e8;
        local_100 = uVar33;
        local_108 = uVar39;
        local_180 = uVar35;
      }
    }
  }
  lVar45 = lVar45 + 1;
  uVar41 = uVar41 + 1;
  goto LAB_0010507f;
LAB_00104fa7:
  if (local_100 < local_e0 + 0xaf) {
    local_108 = uVar26;
    local_180 = uVar23;
    uVar46 = uVar19;
    local_d0 = uVar19 + lVar10;
    iVar16 = iVar52;
    if (uVar6 <= uVar19 + lVar10) {
      local_d0 = uVar6;
    }
    goto LAB_0010548e;
  }
  uVar47 = uVar47 + 1;
  if (2 < uVar14) goto LAB_0010548e;
  uVar14 = uVar14 + 1;
  uVar18 = uVar19 + 5;
  uVar17 = uVar17 - 1;
  local_d8 = (ulong)(byte)((byte)local_d8 + 7);
  local_e0 = local_100;
  uVar23 = local_180;
  uVar19 = uVar46;
  uVar26 = local_108;
  iVar52 = iVar16;
  if (uVar2 <= uVar18) goto LAB_0010548e;
  goto LAB_001049fd;
code_r0x0010510b:
  uVar35 = uVar35 + 8;
  goto LAB_001050ef;
code_r0x00104d96:
  lVar45 = lVar45 + -8;
  uVar18 = uVar18 + 1;
  goto LAB_00104d76;
code_r0x00104ba1:
  lVar34 = lVar34 + -8;
  uVar50 = uVar50 + 1;
  goto LAB_00104b81;
code_r0x001042aa:
  lVar34 = lVar34 + -8;
  uVar18 = uVar18 + 1;
  goto LAB_0010428d;
code_r0x001040af:
  lVar34 = lVar34 + -8;
  uVar40 = uVar40 + 1;
  goto LAB_00104092;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}